

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void Diligent::ParseAttributesInComment
               (String *Comment,
               unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *Attributes)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  const_iterator this;
  bool bVar2;
  bool bVar3;
  reference pcVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  char *local_1a0;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_198;
  undefined1 local_190;
  HashMapStringKey local_188;
  pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  allocator<char> local_141;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined1 local_130 [8];
  String Value;
  const_iterator ValueStartPos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  char *local_e8;
  int local_dc;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  char *local_c8;
  allocator<char> local_a9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 local_98 [8];
  String Attrib;
  const_iterator AttribStart;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  char *local_50;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char *local_28;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  const_iterator Pos;
  unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *Attributes_local;
  String *Comment_local;
  
  Pos._M_current = (char *)Attributes;
  local_20._M_current = (char *)std::__cxx11::string::begin();
  local_30._M_current = (char *)std::__cxx11::string::end();
  local_28 = (char *)Parsing::
                     SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                               (&local_20,&local_30,(char *)0x0);
  local_20 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_28;
  local_38._M_current = (char *)std::__cxx11::string::end();
  bVar2 = __gnu_cxx::operator==(&local_20,&local_38);
  if ((!bVar2) &&
     (pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20), *pcVar4 == '/')) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
    local_40._M_current = (char *)std::__cxx11::string::end();
    bVar3 = __gnu_cxx::operator==(&local_20,&local_40);
    bVar2 = true;
    if (!bVar3) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      bVar2 = false;
      if (*pcVar4 != '/') {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_20);
        bVar2 = *pcVar4 != '*';
      }
    }
    if (!bVar2) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_20);
      do {
        local_48._M_current = (char *)std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator!=(&local_20,&local_48);
        if (!bVar2) {
          return;
        }
        local_58._M_current = (char *)std::__cxx11::string::end();
        local_50 = (char *)Parsing::
                           SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                     (&local_20,&local_58,(char *)0x0);
        local_20 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_50;
        AttribStart._M_current = (char *)std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator==(&local_20,&AttribStart);
        _Var1._M_current = local_20._M_current;
        if (bVar2) {
          return;
        }
        Attrib.field_2._8_8_ = std::__cxx11::string::end();
        local_a8 = Parsing::
                   SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             (&local_20,
                              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)((long)&Attrib.field_2 + 8));
        local_a0._M_current = _Var1._M_current;
        local_20 = local_a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)local_98,local_a0,local_a8,&local_a9);
        std::allocator<char>::~allocator(&local_a9);
        local_d0._M_current = (char *)std::__cxx11::string::end();
        local_c8 = (char *)Parsing::
                           SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                     (&local_20,&local_d0,(char *)0x0);
        local_20 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_c8;
        local_d8._M_current = (char *)std::__cxx11::string::end();
        bVar2 = __gnu_cxx::operator==(&local_20,&local_d8);
        if (bVar2) {
          local_dc = 1;
        }
        else {
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_20);
          if (*pcVar4 == '=') {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_20);
            local_f0._M_current = (char *)std::__cxx11::string::end();
            local_e8 = (char *)Parsing::
                               SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                         (&local_20,&local_f0,(char *)0x0);
            local_20 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_e8;
            ValueStartPos._M_current = (char *)std::__cxx11::string::end();
            bVar2 = __gnu_cxx::operator==(&local_20,&ValueStartPos);
            _Var1._M_current = local_20._M_current;
            if (bVar2) {
              local_dc = 1;
            }
            else {
              Value.field_2._8_8_ = std::__cxx11::string::end();
              local_140 = Parsing::
                          SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                    (&local_20,
                                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)((long)&Value.field_2 + 8));
              local_138._M_current = _Var1._M_current;
              local_20 = local_140;
              std::allocator<char>::allocator();
              std::__cxx11::string::
              string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                        ((string *)local_130,local_138,local_140,&local_141);
              std::allocator<char>::~allocator(&local_141);
              this = Pos;
              HashMapStringKey::HashMapStringKey(&local_188,(String *)local_98,true);
              std::make_pair<Diligent::HashMapStringKey,std::__cxx11::string&>
                        (&local_178,&local_188,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
              pVar5 = std::
                      unordered_map<Diligent::HashMapStringKey,std::__cxx11::string,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>>
                      ::emplace<std::pair<Diligent::HashMapStringKey,std::__cxx11::string>>
                                ((unordered_map<Diligent::HashMapStringKey,std::__cxx11::string,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>>
                                  *)this._M_current,&local_178);
              local_198._M_cur =
                   (__node_type *)
                   pVar5.first.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                   ._M_cur;
              local_190 = pVar5.second;
              std::
              pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair(&local_178);
              HashMapStringKey::~HashMapStringKey(&local_188);
              local_1a8._M_current = (char *)std::__cxx11::string::end();
              local_1a0 = (char *)Parsing::
                                  SkipDelimiters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                            (&local_20,&local_1a8,(char *)0x0);
              local_20 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_1a0;
              local_1b0._M_current = (char *)std::__cxx11::string::end();
              bVar2 = __gnu_cxx::operator==(&local_20,&local_1b0);
              if (bVar2) {
                local_dc = 1;
              }
              else {
                pcVar4 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_20);
                if ((*pcVar4 == ',') ||
                   (pcVar4 = __gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(&local_20), *pcVar4 == ';')) {
                  __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++(&local_20);
                  local_dc = 0;
                }
                else {
                  local_dc = 1;
                }
              }
              std::__cxx11::string::~string((string *)local_130);
            }
          }
          else {
            local_dc = 1;
          }
        }
        std::__cxx11::string::~string((string *)local_98);
      } while (local_dc == 0);
    }
  }
  return;
}

Assistant:

void ParseAttributesInComment(const String& Comment, std::unordered_map<HashMapStringKey, String>& Attributes)
{
    auto Pos = Comment.begin();
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    // ^
    Pos = SkipDelimiters(Pos, Comment.end());
    if (Pos == Comment.end())
        return;
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    //    ^
    if (*Pos != '/')
        return;
    ++Pos;
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    //     ^
    //    // partitioning = fractional_even, outputtopology = triangle_cw */
    //     ^
    if (Pos == Comment.end() || (*Pos != '/' && *Pos != '*'))
        return;
    ++Pos;
    while (Pos != Comment.end())
    {
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //      ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //       ^
        auto AttribStart = Pos;
        Pos              = SkipIdentifier(Pos, Comment.end());
        String Attrib(AttribStart, Pos);
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                   ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                    ^
        if (*Pos != '=')
            return;
        ++Pos;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                     ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                     ^
        auto ValueStartPos = Pos;
        Pos                = SkipIdentifier(Pos, Comment.end());
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                     ^
        String Value(ValueStartPos, Pos);
        Attributes.emplace(make_pair(HashMapStringKey(std::move(Attrib)), Value));

        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                      ^
        if (*Pos != ',' && *Pos != ';')
            return;
        ++Pos;
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                       ^
    }
}